

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::CompressZip
               (uchar *dst,tinyexr_uint64 *compressedSize,uchar *src,unsigned_long src_size)

{
  value_type vVar1;
  char cVar2;
  int *piVar3;
  reference pvVar4;
  value_type *pvVar5;
  uchar *__src;
  ulong in_RCX;
  value_type *pvVar6;
  value_type *pvVar7;
  value_type *in_RDX;
  int *out_len;
  ulong *in_RSI;
  void *in_RDI;
  uchar *ret;
  int outSize;
  int d;
  int p;
  uchar *stop_1;
  uchar *t;
  char *stop;
  char *t2;
  char *t1;
  char *srcPtr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  size_type in_stack_ffffffffffffff18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  size_type in_stack_ffffffffffffff38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  int local_94;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  value_type *pvVar8;
  int quality;
  int data_len;
  uchar *in_stack_ffffffffffffffa8;
  bool local_1;
  
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x462da6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x462dcc);
  pvVar7 = in_RDX;
  piVar3 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pvVar5 = pvVar7 + in_RCX;
  pvVar8 = pvVar4 + (in_RCX + 1 >> 1);
  for (; out_len = piVar3, pvVar6 = pvVar7, pvVar7 < pvVar5; pvVar7 = pvVar7 + 2) {
    pvVar6 = pvVar7 + 1;
    out_len = (int *)((long)piVar3 + 1);
    *(value_type *)piVar3 = *pvVar7;
    if (pvVar5 <= pvVar6) break;
    *pvVar8 = *pvVar6;
    pvVar8 = pvVar8 + 1;
    piVar3 = out_len;
  }
  data_len = (int)((ulong)pvVar6 >> 0x20);
  local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  quality = (int)((ulong)pvVar8 >> 0x20);
  this = local_80;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  vVar1 = *(value_type *)
           &(local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  while (local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    ((long)&(local_80->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1),
        local_80 < (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pvVar4 + in_RCX)) {
    cVar2 = *(value_type *)
             &(local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start - vVar1;
    vVar1 = *(value_type *)
             &(local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    *(value_type *)
     &(local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start = cVar2 + 0x80;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  __src = stbi_zlib_compress(in_stack_ffffffffffffffa8,data_len,out_len,quality);
  if (__src == (uchar *)0x0) {
    local_1 = false;
  }
  else {
    memcpy(in_RDI,__src,(long)local_94);
    free(__src);
    *in_RSI = (long)local_94;
    if (in_RCX <= *in_RSI) {
      *in_RSI = in_RCX;
      memcpy(in_RDI,in_RDX,in_RCX);
    }
    local_1 = true;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return local_1;
}

Assistant:

static bool CompressZip(unsigned char *dst,
                        tinyexr::tinyexr_uint64 &compressedSize,
                        const unsigned char *src, unsigned long src_size) {
  std::vector<unsigned char> tmpBuf(src_size);

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  //
  // Reorder the pixel data.
  //

  const char *srcPtr = reinterpret_cast<const char *>(src);

  {
    char *t1 = reinterpret_cast<char *>(&tmpBuf.at(0));
    char *t2 = reinterpret_cast<char *>(&tmpBuf.at(0)) + (src_size + 1) / 2;
    const char *stop = srcPtr + src_size;

    for (;;) {
      if (srcPtr < stop)
        *(t1++) = *(srcPtr++);
      else
        break;

      if (srcPtr < stop)
        *(t2++) = *(srcPtr++);
      else
        break;
    }
  }

  //
  // Predictor.
  //

  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + src_size;
    int p = t[-1];

    while (t < stop) {
      int d = int(t[0]) - p + (128 + 256);
      p = t[0];
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

#if TINYEXR_USE_MINIZ
  //
  // Compress the data using miniz
  //

  mz_ulong outSize = mz_compressBound(src_size);
  int ret = mz_compress(
      dst, &outSize, static_cast<const unsigned char *>(&tmpBuf.at(0)),
      src_size);
  if (ret != MZ_OK) {
    return false;
  }

  compressedSize = outSize;
#elif TINYEXR_USE_STB_ZLIB
  int outSize;
  unsigned char* ret = stbi_zlib_compress(const_cast<unsigned char*>(&tmpBuf.at(0)), src_size, &outSize, 8);
  if (!ret) {
    return false;
  }
  memcpy(dst, ret, outSize);
  free(ret);

  compressedSize = outSize;
#else
  uLong outSize = compressBound(static_cast<uLong>(src_size));
  int ret = compress(dst, &outSize, static_cast<const Bytef *>(&tmpBuf.at(0)),
                     src_size);
  if (ret != Z_OK) {
    return false;
  }

  compressedSize = outSize;
#endif

  // Use uncompressed data when compressed data is larger than uncompressed.
  // (Issue 40)
  if (compressedSize >= src_size) {
    compressedSize = src_size;
    memcpy(dst, src, src_size);
  }

  return true;
}